

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

LabelInstr * __thiscall IR::LabelInstr::CloneLabel(LabelInstr *this,BOOL fCreate)

{
  ImplicitCallFlags flags;
  OpCode opcode;
  uint uVar1;
  Func *func;
  Cloner *pCVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  LabelInstr **ppLVar6;
  HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator> *pHVar7;
  ProfiledLabelInstr *element;
  LabelInstr *pLVar8;
  
  func = (this->super_Instr).m_func;
  pCVar2 = func->topFunc->m_cloner;
  if (pCVar2 == (Cloner *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x214,"(cloner)","Use Func::BeginClone to initialize cloner");
    if (!bVar4) goto LAB_004ba950;
    *puVar5 = 0;
  }
  if (pCVar2->labelMap == (HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator> *)0x0) {
    if (fCreate == 0) {
      return (LabelInstr *)0x0;
    }
    pHVar7 = HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator>::New
                       (&pCVar2->alloc->super_ArenaAllocator,7);
    pCVar2->labelMap = pHVar7;
LAB_004ba798:
    pLVar8 = (LabelInstr *)0x0;
  }
  else {
    ppLVar6 = HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator>::Get(pCVar2->labelMap,this->m_id);
    if (ppLVar6 == (LabelInstr **)0x0) goto LAB_004ba798;
    pLVar8 = *ppLVar6;
  }
  if (pLVar8 != (LabelInstr *)0x0) {
    return pLVar8;
  }
  if (fCreate == 0) {
    return (LabelInstr *)0x0;
  }
  opcode = (this->super_Instr).m_opcode;
  if ((this->super_Instr).m_kind == InstrKindProfiledLabel) {
    flags = *(ImplicitCallFlags *)&this[1].super_Instr._vptr_Instr;
    if ((this->super_Instr).m_kind != InstrKindProfiledLabel) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xe3,"(this->IsProfiledLabelInstr())","Bad call to AsProfiledLabelInstr()"
                        );
      if (!bVar4) goto LAB_004ba950;
      *puVar5 = 0;
    }
    element = ProfiledLabelInstr::New
                        (opcode,func,flags,
                         *(LoopFlags *)((long)&this[1].super_Instr._vptr_Instr + 1));
    if ((this->super_Instr).m_kind != InstrKindProfiledLabel) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xe3,"(this->IsProfiledLabelInstr())","Bad call to AsProfiledLabelInstr()"
                        );
      if (!bVar4) goto LAB_004ba950;
      *puVar5 = 0;
    }
    uVar1 = *(uint *)((long)&this[1].super_Instr._vptr_Instr + 4);
    if ((element->super_LabelInstr).super_Instr.m_kind != InstrKindProfiledLabel) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xe3,"(this->IsProfiledLabelInstr())","Bad call to AsProfiledLabelInstr()"
                        );
      if (!bVar4) {
LAB_004ba950:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    element->loopNum = uVar1;
  }
  else {
    element = (ProfiledLabelInstr *)New(opcode,func,(bool)((this->field_0x78 & 2) >> 1));
  }
  (element->super_LabelInstr).field_0x78 =
       (element->super_LabelInstr).field_0x78 & 0xfe | this->field_0x78 & 1;
  HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator>::FindOrInsert
            (pCVar2->labelMap,&element->super_LabelInstr,this->m_id);
  return &element->super_LabelInstr;
}

Assistant:

LabelInstr *
LabelInstr::CloneLabel(BOOL fCreate)
{
    Func * func = this->m_func;
    Cloner * cloner = func->GetCloner();
    IR::LabelInstr * instrLabel = nullptr;

    AssertMsg(cloner, "Use Func::BeginClone to initialize cloner");

    if (cloner->labelMap == nullptr)
    {
        if (!fCreate)
        {
            return nullptr;
        }
        cloner->labelMap = HashTable<LabelInstr*>::New(cloner->alloc, 7);
    }
    else
    {
        IR::LabelInstr ** map = cloner->labelMap->Get(this->m_id);
        if (map)
        {
            instrLabel = *map;
        }
    }

    if (instrLabel == nullptr)
    {
        if (!fCreate)
        {
            return nullptr;
        }
        if (this->IsProfiledLabelInstr())
        {
            instrLabel = IR::ProfiledLabelInstr::New(this->m_opcode, func, this->AsProfiledLabelInstr()->loopImplicitCallFlags, this->AsProfiledLabelInstr()->loopFlags);
#if DBG
            instrLabel->AsProfiledLabelInstr()->loopNum = this->AsProfiledLabelInstr()->loopNum;
#endif
        }
        else
        {
            instrLabel = IR::LabelInstr::New(this->m_opcode, func, this->isOpHelper);
        }
        instrLabel->m_isLoopTop = this->m_isLoopTop;
        cloner->labelMap->FindOrInsert(instrLabel, this->m_id);
    }

    return instrLabel;
}